

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O2

void add_noise_to_block_hbd
               (aom_film_grain_t *params,uint16_t *luma,uint16_t *cb,uint16_t *cr,int luma_stride,
               int chroma_stride,int *luma_grain,int *cb_grain,int *cr_grain,int luma_grain_stride,
               int chroma_grain_stride,int half_luma_height,int half_luma_width,int bit_depth,
               int chroma_subsamp_y,int chroma_subsamp_x,int mc_identity)

{
  ushort uVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  byte bVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int j;
  uint uVar22;
  bool bVar23;
  bool bVar24;
  int local_c8;
  int local_c4;
  int local_c0;
  uint16_t *local_b8;
  uint16_t *local_b0;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int *local_78;
  int *local_70;
  int *local_68;
  
  bVar13 = (byte)bit_depth - 8;
  local_c8 = 1 << ((byte)bit_depth & 0x1f);
  bVar5 = (byte)params->scaling_shift;
  iVar18 = 1 << (bVar5 - 1 & 0x1f);
  bVar23 = true;
  if (params->num_cb_points < 1) {
    bVar23 = params->chroma_scaling_from_luma != 0;
  }
  iVar9 = params->num_cr_points;
  bVar24 = params->chroma_scaling_from_luma == 0;
  if (bVar24) {
    local_a0 = params->cb_mult + -0x80;
    local_9c = params->cb_luma_mult + -0x80;
    local_c4 = (params->cb_offset << (bVar13 & 0x1f)) - local_c8;
    local_98 = params->cr_mult + -0x80;
    local_94 = params->cr_luma_mult + -0x80;
    local_c8 = (params->cr_offset << (bVar13 & 0x1f)) - local_c8;
  }
  else {
    local_c8 = 0;
    local_98 = 0;
    local_c4 = 0;
    local_9c = 0x40;
    local_a0 = 0;
    local_94 = local_9c;
  }
  if (params->clip_to_restricted_range == 0) {
    iVar20 = (0x100 << (bVar13 & 0x1f)) + -1;
    iVar21 = 0;
    local_c0 = iVar20;
    iVar10 = iVar20;
  }
  else {
    iVar21 = 0x10 << (bVar13 & 0x1f);
    local_c0 = 0xeb << (bVar13 & 0x1f);
    iVar10 = 0xf0 << (bVar13 & 0x1f);
    if (mc_identity != 0) {
      iVar10 = local_c0;
    }
    iVar20 = (0x100 << (bVar13 & 0x1f)) + -1;
  }
  local_70 = cr_grain;
  local_78 = cb_grain;
  local_68 = luma_grain;
  bVar13 = 1 - (byte)chroma_subsamp_y & 0x1f;
  bVar3 = 1U - (char)chroma_subsamp_x & 0x1f;
  iVar6 = half_luma_width << bVar3;
  if (half_luma_width << bVar3 < 1) {
    iVar6 = 0;
  }
  iVar2 = params->num_y_points;
  uVar12 = (ulong)(uint)(half_luma_height << bVar13);
  if (half_luma_height << bVar13 < 1) {
    uVar12 = 0;
  }
  local_b8 = cb;
  local_b0 = cr;
  for (uVar17 = 0; uVar14 = (uint16_t)iVar21, uVar17 != uVar12; uVar17 = uVar17 + 1) {
    iVar16 = ((int)uVar17 << ((byte)chroma_subsamp_y & 0x1f)) * luma_stride;
    for (uVar19 = 0; (uint)(iVar6 * 2) != uVar19; uVar19 = uVar19 + 2) {
      if (chroma_subsamp_x == 0) {
        uVar22 = (uint)*(ushort *)((long)luma + uVar19 + (long)iVar16 * 2);
      }
      else {
        lVar11 = (long)(iVar16 + (int)uVar19);
        uVar22 = (uint)luma[lVar11 + 1] + (uint)luma[lVar11] + 1 >> 1 & 0xffff;
      }
      if (bVar23) {
        uVar1 = *(ushort *)((long)local_b8 + uVar19);
        iVar7 = ((int)(local_a0 * (uint)uVar1 + uVar22 * local_9c) >> 6) + local_c4;
        iVar8 = iVar7;
        if (iVar20 <= iVar7) {
          iVar8 = iVar20;
        }
        if (iVar7 < 0) {
          iVar8 = 0;
        }
        iVar8 = scale_LUT(scaling_lut_cb,iVar8,bit_depth);
        iVar7 = (iVar8 * *(int *)((long)local_78 + uVar19 * 2) + iVar18 >> (bVar5 & 0x1f)) +
                (uint)uVar1;
        iVar8 = iVar7;
        if (iVar10 <= iVar7) {
          iVar8 = iVar10;
        }
        uVar15 = uVar14;
        if (iVar21 <= iVar7) {
          uVar15 = (uint16_t)iVar8;
        }
        *(uint16_t *)((long)local_b8 + uVar19) = uVar15;
      }
      if (0 < iVar9 || !bVar24) {
        uVar1 = *(ushort *)((long)local_b0 + uVar19);
        iVar7 = ((int)(local_98 * (uint)uVar1 + uVar22 * local_94) >> 6) + local_c8;
        iVar8 = iVar7;
        if (iVar20 <= iVar7) {
          iVar8 = iVar20;
        }
        if (iVar7 < 0) {
          iVar8 = 0;
        }
        iVar8 = scale_LUT(scaling_lut_cr,iVar8,bit_depth);
        iVar7 = (iVar8 * *(int *)((long)local_70 + uVar19 * 2) + iVar18 >> (bVar5 & 0x1f)) +
                (uint)uVar1;
        iVar8 = iVar7;
        if (iVar10 <= iVar7) {
          iVar8 = iVar10;
        }
        uVar15 = uVar14;
        if (iVar21 <= iVar7) {
          uVar15 = (uint16_t)iVar8;
        }
        *(uint16_t *)((long)local_b0 + uVar19) = uVar15;
      }
    }
    local_70 = local_70 + chroma_grain_stride;
    local_b0 = local_b0 + chroma_stride;
    local_78 = local_78 + chroma_grain_stride;
    local_b8 = local_b8 + chroma_stride;
  }
  if (0 < iVar2) {
    uVar12 = 0;
    uVar22 = half_luma_width * 2;
    if (half_luma_width * 2 < 1) {
      uVar22 = 0;
    }
    uVar4 = half_luma_height * 2;
    if (half_luma_height * 2 < 1) {
      uVar4 = 0;
    }
    for (; uVar12 != uVar4; uVar12 = uVar12 + 1) {
      for (uVar17 = 0; uVar22 != uVar17; uVar17 = uVar17 + 1) {
        uVar1 = luma[uVar17];
        iVar9 = scale_LUT(scaling_lut_y,(uint)uVar1,bit_depth);
        iVar10 = (iVar9 * local_68[uVar17] + iVar18 >> (bVar5 & 0x1f)) + (uint)uVar1;
        iVar9 = iVar10;
        if (local_c0 <= iVar10) {
          iVar9 = local_c0;
        }
        uVar15 = uVar14;
        if (iVar21 <= iVar10) {
          uVar15 = (uint16_t)iVar9;
        }
        luma[uVar17] = uVar15;
      }
      local_68 = local_68 + luma_grain_stride;
      luma = luma + luma_stride;
    }
  }
  return;
}

Assistant:

static void add_noise_to_block_hbd(
    const aom_film_grain_t *params, uint16_t *luma, uint16_t *cb, uint16_t *cr,
    int luma_stride, int chroma_stride, int *luma_grain, int *cb_grain,
    int *cr_grain, int luma_grain_stride, int chroma_grain_stride,
    int half_luma_height, int half_luma_width, int bit_depth,
    int chroma_subsamp_y, int chroma_subsamp_x, int mc_identity) {
  int cb_mult = params->cb_mult - 128;            // fixed scale
  int cb_luma_mult = params->cb_luma_mult - 128;  // fixed scale
  // offset value depends on the bit depth
  int cb_offset = (params->cb_offset << (bit_depth - 8)) - (1 << bit_depth);

  int cr_mult = params->cr_mult - 128;            // fixed scale
  int cr_luma_mult = params->cr_luma_mult - 128;  // fixed scale
  // offset value depends on the bit depth
  int cr_offset = (params->cr_offset << (bit_depth - 8)) - (1 << bit_depth);

  int rounding_offset = (1 << (params->scaling_shift - 1));

  int apply_y = params->num_y_points > 0 ? 1 : 0;
  int apply_cb =
      (params->num_cb_points > 0 || params->chroma_scaling_from_luma) > 0 ? 1
                                                                          : 0;
  int apply_cr =
      (params->num_cr_points > 0 || params->chroma_scaling_from_luma) > 0 ? 1
                                                                          : 0;

  if (params->chroma_scaling_from_luma) {
    cb_mult = 0;        // fixed scale
    cb_luma_mult = 64;  // fixed scale
    cb_offset = 0;

    cr_mult = 0;        // fixed scale
    cr_luma_mult = 64;  // fixed scale
    cr_offset = 0;
  }

  int min_luma, max_luma, min_chroma, max_chroma;

  if (params->clip_to_restricted_range) {
    min_luma = min_luma_legal_range << (bit_depth - 8);
    max_luma = max_luma_legal_range << (bit_depth - 8);

    if (mc_identity) {
      min_chroma = min_luma_legal_range << (bit_depth - 8);
      max_chroma = max_luma_legal_range << (bit_depth - 8);
    } else {
      min_chroma = min_chroma_legal_range << (bit_depth - 8);
      max_chroma = max_chroma_legal_range << (bit_depth - 8);
    }
  } else {
    min_luma = min_chroma = 0;
    max_luma = max_chroma = (256 << (bit_depth - 8)) - 1;
  }

  for (int i = 0; i < (half_luma_height << (1 - chroma_subsamp_y)); i++) {
    for (int j = 0; j < (half_luma_width << (1 - chroma_subsamp_x)); j++) {
      int average_luma = 0;
      if (chroma_subsamp_x) {
        average_luma = (luma[(i << chroma_subsamp_y) * luma_stride +
                             (j << chroma_subsamp_x)] +
                        luma[(i << chroma_subsamp_y) * luma_stride +
                             (j << chroma_subsamp_x) + 1] +
                        1) >>
                       1;
      } else {
        average_luma = luma[(i << chroma_subsamp_y) * luma_stride + j];
      }

      if (apply_cb) {
        cb[i * chroma_stride + j] = clamp(
            cb[i * chroma_stride + j] +
                ((scale_LUT(scaling_lut_cb,
                            clamp(((average_luma * cb_luma_mult +
                                    cb_mult * cb[i * chroma_stride + j]) >>
                                   6) +
                                      cb_offset,
                                  0, (256 << (bit_depth - 8)) - 1),
                            bit_depth) *
                      cb_grain[i * chroma_grain_stride + j] +
                  rounding_offset) >>
                 params->scaling_shift),
            min_chroma, max_chroma);
      }
      if (apply_cr) {
        cr[i * chroma_stride + j] = clamp(
            cr[i * chroma_stride + j] +
                ((scale_LUT(scaling_lut_cr,
                            clamp(((average_luma * cr_luma_mult +
                                    cr_mult * cr[i * chroma_stride + j]) >>
                                   6) +
                                      cr_offset,
                                  0, (256 << (bit_depth - 8)) - 1),
                            bit_depth) *
                      cr_grain[i * chroma_grain_stride + j] +
                  rounding_offset) >>
                 params->scaling_shift),
            min_chroma, max_chroma);
      }
    }
  }

  if (apply_y) {
    for (int i = 0; i < (half_luma_height << 1); i++) {
      for (int j = 0; j < (half_luma_width << 1); j++) {
        luma[i * luma_stride + j] =
            clamp(luma[i * luma_stride + j] +
                      ((scale_LUT(scaling_lut_y, luma[i * luma_stride + j],
                                  bit_depth) *
                            luma_grain[i * luma_grain_stride + j] +
                        rounding_offset) >>
                       params->scaling_shift),
                  min_luma, max_luma);
      }
    }
  }
}